

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double find_split_rel_gain_weighted_t<double,double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>>
                 (double *x,double xmean,size_t *ix_arr,size_t st,size_t end,double *split_point,
                 size_t *split_ix,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  double *pdVar1;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_RCX;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_RDX;
  long in_RSI;
  long in_RDI;
  double *in_R8;
  undefined8 *in_R9;
  double in_XMM0_Qa;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t row_2;
  size_t row_1;
  size_t row;
  double sumw_tot;
  double sumw;
  double sum_tot;
  double sum_right;
  double sum_left;
  double best_gain;
  double this_gain;
  unsigned_long *in_stack_ffffffffffffff68;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff70;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *x_00;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_58;
  double local_50;
  double local_8;
  
  local_50 = -INFINITY;
  *in_R9 = 0;
  local_58 = 0.0;
  local_68 = 0.0;
  local_70 = 0.0;
  local_78 = 0.0;
  for (local_80 = in_RDX; x_00 = in_RDX, local_80 <= in_RCX;
      local_80 = (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                  *)((long)&(local_80->m_ht).super_power_of_two_growth_policy<2UL>.m_mask + 1)) {
    pdVar1 = tsl::
             robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_78 = *pdVar1 + local_78;
  }
  for (; x_00 <= in_RCX;
      x_00 = (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *)((long)&(x_00->m_ht).super_power_of_two_growth_policy<2UL>.m_mask + 1)) {
    local_68 = (*(double *)(in_RDI + *(long *)(in_RSI + (long)x_00 * 8) * 8) - in_XMM0_Qa) +
               local_68;
  }
  for (; in_RDX < in_RCX;
      in_RDX = (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                *)((long)&(in_RDX->m_ht).super_power_of_two_growth_policy<2UL>.m_mask + 1)) {
    pdVar1 = tsl::
             robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             ::operator[](in_RDX,in_stack_ffffffffffffff68);
    local_70 = *pdVar1 + local_70;
    local_58 = (*(double *)(in_RDI + *(long *)(in_RSI + (long)in_RDX * 8) * 8) - in_XMM0_Qa) +
               local_58;
    dVar2 = *(double *)(in_RDI + *(long *)(in_RSI + (long)in_RDX * 8) * 8);
    pdVar1 = (double *)(in_RDI + *(long *)(in_RSI + 8 + (long)in_RDX * 8) * 8);
    if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) &&
       (dVar2 = local_58 * (local_58 / local_70) +
                (local_68 - local_58) * ((local_68 - local_58) / (local_78 - local_70)),
       local_50 < dVar2)) {
      *in_R9 = in_RDX;
      local_50 = dVar2;
    }
  }
  if (-INFINITY < local_50) {
    dVar2 = midpoint<double>((double)x_00,(double)in_RDX);
    *in_R8 = dVar2;
    dVar2 = std::numeric_limits<double>::epsilon();
    uVar3 = SUB84(dVar2,0);
    uVar4 = (int)((ulong)dVar2 >> 0x20);
    if (dVar2 <= local_50) {
      uVar3 = SUB84(local_50,0);
      uVar4 = (int)((ulong)local_50 >> 0x20);
    }
    local_8 = (double)(~-(ulong)NAN(local_50) & CONCAT44(uVar4,uVar3) |
                      -(ulong)NAN(local_50) & (ulong)dVar2);
  }
  else {
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

double find_split_rel_gain_weighted_t(real_t_ *restrict x, real_t_ xmean, size_t *restrict ix_arr, size_t st, size_t end, double &split_point, size_t &restrict split_ix, mapping &restrict w)
{
    real_t this_gain;
    real_t best_gain = -HUGE_VAL;
    split_ix = 0; /* <- avoid out-of-bounds at the end */
    real_t sum_left = 0, sum_right = 0, sum_tot = 0, sumw = 0, sumw_tot = 0;

    for (size_t row = st; row <= end; row++)
        sumw_tot += w[ix_arr[row]];
    for (size_t row = st; row <= end; row++)
        sum_tot += x[ix_arr[row]] - xmean;
    for (size_t row = st; row < end; row++)
    {
        sumw += w[ix_arr[row]];
        sum_left += x[ix_arr[row]] - xmean;
        if (x[ix_arr[row]] == x[ix_arr[row+1]])
            continue;

        sum_right = sum_tot - sum_left;
        this_gain =   sum_left  * (sum_left  / sumw)
                    + sum_right * (sum_right / (sumw_tot - sumw));
        if (this_gain > best_gain)
        {
            best_gain = this_gain;
            split_ix = row;
        }
    }

    if (best_gain <= -HUGE_VAL)
        return best_gain;
    split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    return std::fmax((double)best_gain, std::numeric_limits<double>::epsilon());
}